

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

void ctemplate_htmlparser::nopad_strncpy(char *dst,char *src,size_t dst_size,size_t src_size)

{
  size_t __n;
  
  __n = 0x100;
  if (dst_size < 0x100) {
    __n = dst_size;
  }
  strncpy(dst,src,__n);
  if (dst_size != 0) {
    dst[__n - 1] = '\0';
  }
  return;
}

Assistant:

static inline void nopad_strncpy(char *dst, const char *src, size_t dst_size,
                                 size_t src_size)
{
  size_t size;

  /* size = min(dst_size, src_size) */
  size = dst_size > src_size ? src_size : dst_size;
  strncpy(dst, src, size);
  if (size > 0)
    dst[size - 1] = '\0';
}